

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintMessage
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  char *pcVar1;
  long lVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  bool bVar5;
  int iVar6;
  Descriptor *pDVar7;
  size_t sVar8;
  ulong uVar9;
  UnknownFieldSet *unknown_fields;
  Nonnull<const_char_*> pcVar10;
  Reflection *this_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  long lVar11;
  pointer ppFVar12;
  size_type __rlen;
  pointer ppFVar13;
  Metadata MVar14;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  pointer local_50;
  FieldDescriptor *local_48;
  LogMessageFatal local_40;
  
  if (generator != (BaseTextGenerator *)0x0) {
    MVar14 = Message::GetMetadata(message);
    pDVar7 = MVar14.descriptor;
    pcVar1 = (pDVar7->all_names_).payload_;
    uVar9 = (ulong)*(ushort *)(pcVar1 + 2);
    sVar8 = strlen("google.protobuf.Any");
    if (((sVar8 != uVar9) ||
        (((uVar9 != 0 && (iVar6 = bcmp(pcVar1 + ~uVar9,"google.protobuf.Any",uVar9), iVar6 != 0)) ||
         (this->expand_any_ != true)))) || (bVar5 = PrintAny(this,message,generator), !bVar5)) {
      MVar14 = Message::GetMetadata(message);
      this_00 = MVar14.reflection;
      local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pDVar7->options_->field_0)._impl_.map_entry_ == true) {
        if ((long)pDVar7->field_count_ < 1) {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (0,(long)pDVar7->field_count_,"index < field_count()");
        }
        else {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa88,pcVar10);
LAB_0025c389:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        local_48 = pDVar7->fields_;
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_68,&local_48);
        if ((long)pDVar7->field_count_ < 2) {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (1,(long)pDVar7->field_count_,"index < field_count()");
        }
        else {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa88,pcVar10);
          goto LAB_0025c389;
        }
        local_48 = pDVar7->fields_ + 1;
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_68,&local_48);
      }
      else {
        Reflection::ListFields(this_00,message,&local_68);
      }
      ppFVar4 = local_68.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppFVar13 = local_68.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar3 = local_68.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->print_message_fields_in_index_order_ == true) &&
         (local_68.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_68.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        lVar11 = (long)local_68.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = lVar11 >> 3;
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        local_50 = local_68.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (local_68.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_68.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar11 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                    (local_50,ppFVar4);
          ppFVar13 = local_68.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppFVar3 = local_68.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ppFVar12 = local_50 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                    (local_50,ppFVar12);
          for (; ppFVar13 = local_68.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
              ppFVar3 = local_68.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish, ppFVar12 != ppFVar4;
              ppFVar12 = ppFVar12 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                      (ppFVar12);
          }
        }
      }
      for (; ppFVar13 != ppFVar3; ppFVar13 = ppFVar13 + 1) {
        PrintField(this,message,this_00,*ppFVar13,generator);
      }
      if (this->hide_unknown_fields_ == false) {
        unknown_fields = Reflection::GetUnknownFields(this_00,message);
        PrintUnknownFields(this,unknown_fields,generator,10);
      }
      if (local_68.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintMessage(const Message& message,
                                       BaseTextGenerator* generator) const {
  if (generator == nullptr) {
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  const Reflection* reflection = message.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  if (descriptor->options().map_entry()) {
    fields.push_back(descriptor->field(0));
    fields.push_back(descriptor->field(1));
  } else {
    reflection->ListFields(message, &fields);
  }

  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (const FieldDescriptor* field : fields) {
    PrintField(message, reflection, field, generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator,
                       kUnknownFieldRecursionLimit);
  }
}